

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void pobr::utils::Logger::print(uint *labelShift,string *message)

{
  char cVar1;
  ostream *poVar2;
  istream *piVar3;
  string line;
  stringstream messageStream;
  char *local_1f8;
  long local_1f0;
  char local_1e8 [16];
  char *local_1d8;
  long local_1d0;
  char local_1c8 [16];
  long local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(message->_M_dataplus)._M_p,message->_M_string_length);
  local_1f8 = local_1e8;
  local_1f0 = 0;
  local_1e8[0] = '\0';
  cVar1 = std::ios::widen((char)(stringstream *)local_1b8 +
                          (char)*(undefined8 *)(local_1b8[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_1b8,(string *)&local_1f8,cVar1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_1f8,local_1f0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_1b8[0] + -0x18) + (char)(istream *)local_1b8
                           );
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b8,(string *)&local_1f8,cVar1);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    local_1d8 = local_1c8;
    std::__cxx11::string::_M_construct((ulong)&local_1d8,(char)*labelShift);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_1d8,local_1d0);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1f8,local_1f0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8);
    }
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Logger::print(const unsigned int& labelShift, const std::string& message)
{
    std::stringstream messageStream;
    messageStream << message;

    std::string line;

    std::getline(messageStream, line);
    std::cout << line << std::endl;

    while (std::getline(messageStream, line))
    {
        std::cout << std::string(labelShift, ' ') << line << std::endl;
    }
}